

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
perform_shutdown_related_actions_if_needed
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_10;
  
  if (this->m_shutdown_status == must_be_started) {
    this->m_shutdown_status = in_progress;
    local_10.this = this;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::perform_shutdown_related_actions_if_needed(std::unique_lock<std::mutex>&)::_lambda()_1_>
              (acquired_lock,&local_10);
  }
  if (this->m_shutdown_status == in_progress) {
    bVar1 = st_reusable_stuff::coop_repo_t::has_live_coop(&this->m_coop_repo);
    if (!bVar1) {
      this->m_shutdown_status = completed;
    }
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::perform_shutdown_related_actions_if_needed(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		if( shutdown_status_t::must_be_started == m_shutdown_status )
			{
				// Shutdown procedure must be started.
				m_shutdown_status = shutdown_status_t::in_progress;

				// All registered cooperations must be deregistered now.
				// We must unlock out main lock because there is a need to
				// push a final event for deregisteing agents to event queue.
				helpers::unlock_do_and_lock_again( acquired_lock,
					[this] {
						m_coop_repo.deregister_all_coop();
					} );
			}

		if( shutdown_status_t::in_progress == m_shutdown_status )
			{
				// If there is no more live coops then shutdown must be completed.
				if( !m_coop_repo.has_live_coop() )
					m_shutdown_status = shutdown_status_t::completed;
			}
	}